

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::_load_bmp(CImg<unsigned_char> *this,FILE *file,char *filename)

{
  uchar uVar1;
  int iVar2;
  FILE *pFVar3;
  uchar *puVar4;
  byte bVar5;
  int x;
  uint uVar6;
  int iVar7;
  uint uVar8;
  FILE *__stream;
  ulong uVar9;
  ulong uVar10;
  size_t sVar11;
  size_t sVar12;
  byte *pbVar13;
  CImgArgumentException *this_00;
  CImgIOException *pCVar14;
  int x_2;
  long lVar15;
  byte bVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  byte bVar20;
  char *pcVar21;
  char *pcVar22;
  uchar *puVar23;
  uint uVar24;
  uint uVar25;
  uchar local_d1;
  ulong local_d0;
  uint local_c8;
  uint local_c4;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  FILE *local_a8;
  int local_a0;
  uint local_9c;
  CImg<unsigned_char> buffer;
  CImg<int> colormap;
  CImg<unsigned_char> header;
  
  if (file == (FILE *)0x0 && filename == (char *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    pcVar21 = "non-";
    if (this->_is_shared != false) {
      pcVar21 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_bmp(): Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar21,"unsigned char");
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  __stream = (FILE *)file;
  if (file == (FILE *)0x0) {
    __stream = cimg::fopen(filename,"rb");
  }
  CImg(&header,0x36,1,1,1);
  cimg::fread<unsigned_char>(header._data,0x36,(FILE *)__stream);
  local_a8 = file;
  if ((*header._data != 'B') || (header._data[1] != 'M')) {
    if (file == (FILE *)0x0) {
      cimg::fclose(__stream);
    }
    pCVar14 = (CImgIOException *)__cxa_allocate_exception(0x10);
    pcVar21 = "non-";
    if (this->_is_shared != false) {
      pcVar21 = "";
    }
    pcVar22 = "(FILE*)";
    if (filename != (char *)0x0) {
      pcVar22 = filename;
    }
    CImgIOException::CImgIOException
              (pCVar14,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_bmp(): Invalid BMP file \'%s\'.",
               (ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar21,"unsigned char",pcVar22);
    __cxa_throw(pCVar14,&CImgIOException::typeinfo,CImgException::~CImgException);
  }
  uVar8 = *(uint *)(header._data + 2);
  uVar9 = (ulong)uVar8;
  uVar25 = *(uint *)(header._data + 10);
  iVar2 = *(int *)(header._data + 0xe);
  local_b0 = (long)(int)((uint)header._data[0x15] << 0x18) |
             (ulong)*(ushort *)(header._data + 0x13) << 8;
  bVar16 = header._data[0x18];
  uVar24 = (uint)header._data[0x19];
  local_a0 = *(int *)(header._data + 0x1e);
  local_9c = *(uint *)(header._data + 0x2e);
  local_c4 = (uint)*(ushort *)(header._data + 0x1c);
  if ((uVar8 == 0) ||
     (uVar10 = (ulong)header._data[0x12], uVar17 = (uint)*(ushort *)(header._data + 0x16),
     uVar8 == uVar25)) {
    local_d0 = CONCAT44(local_d0._4_4_,(uint)*(ushort *)(header._data + 0x16));
    local_c8 = (uint)header._data[0x19];
    local_b8 = (ulong)header._data[0x12];
    fseek(__stream,0,2);
    uVar9 = ftell(__stream);
    uVar24 = local_c8;
    fseek(__stream,0x36,0);
    uVar10 = local_b8;
    uVar17 = (uint)local_d0;
  }
  local_b0 = local_b0 + uVar10;
  uVar24 = uVar24 << 0x18;
  if (0x28 < iVar2) {
    local_b8 = uVar9;
    fseek(__stream,(ulong)(iVar2 - 0x28),1);
    uVar9 = local_b8;
  }
  uVar17 = (uint)bVar16 << 0x10 | uVar17 | uVar24;
  uVar8 = (int)local_b0 >> 0x1f;
  if (local_c4 == 4) {
    uVar10 = (ulong)uVar8 << 0x20 | local_b0 & 0xffffffff;
    local_d0 = (ulong)(uint)((int)((long)uVar10 % 2) + (int)((long)uVar10 / 2));
  }
  else if (local_c4 == 1) {
    local_d0 = (ulong)(((int)((long)((ulong)uVar8 << 0x20 | local_b0 & 0xffffffff) / 8) + 1) -
                      (uint)((uVar10 & 7) == 0));
  }
  else {
    local_d0 = (long)(local_c4 * local_b0) / 8;
  }
  uVar6 = -(int)local_d0 & 3;
  local_c0 = (ulong)uVar6;
  uVar8 = -uVar17;
  if (0 < (int)uVar17) {
    uVar8 = uVar17;
  }
  iVar7 = uVar6 + (int)local_d0;
  local_b8 = CONCAT44(local_b8._4_4_,iVar7);
  uVar10 = (long)iVar7 * (ulong)uVar8;
  uVar9 = (long)(int)uVar9 - (long)(int)uVar25;
  if (uVar10 <= uVar9) {
    uVar9 = uVar10;
  }
  colormap._data = (int *)0x0;
  colormap._width = 0;
  colormap._height = 0;
  colormap._depth = 0;
  colormap._spectrum = 0;
  colormap._is_shared = false;
  uVar17 = 1 << ((byte)local_c4 & 0x1f);
  if (local_9c != 0) {
    uVar17 = local_9c;
  }
  iVar7 = 0;
  local_c8 = uVar24;
  if (local_c4 < 0x10) {
    CImg<int>::assign(&colormap,uVar17,1,1,1);
    cimg::fread<int>(colormap._data,(long)(int)uVar17,(FILE *)__stream);
    iVar7 = uVar17 << 2;
  }
  uVar25 = (uVar25 - (iVar2 + iVar7)) - 0xe;
  if (0 < (int)uVar25) {
    fseek(__stream,(ulong)uVar25,1);
  }
  buffer._data = (uchar *)0x0;
  buffer._width = 0;
  buffer._height = 0;
  buffer._depth = 0;
  buffer._spectrum = 0;
  buffer._is_shared = false;
  if (uVar9 < 0x1800000) {
    local_d1 = '\0';
    assign(&buffer,(uint)uVar9,1,1,1,&local_d1);
    cimg::fread<unsigned_char>(buffer._data,uVar9,(FILE *)__stream);
  }
  else {
    assign(&buffer,(uint)local_b8,1,1,1);
  }
  pbVar13 = buffer._data;
  if (local_a0 - 1U < 2) {
    if (local_a8 != (FILE *)0x0) {
      pCVar14 = (CImgIOException *)__cxa_allocate_exception(0x10);
      pcVar21 = "non-";
      if (this->_is_shared != false) {
        pcVar21 = "";
      }
      CImgIOException::CImgIOException
                (pCVar14,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_bmp(): Unable to load compressed data from \'(*FILE)\' inputs."
                 ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                 (ulong)this->_spectrum,this->_data,pcVar21,"unsigned char");
      __cxa_throw(pCVar14,&CImgIOException::typeinfo,CImgException::~CImgException);
    }
    cimg::fclose(__stream);
    this = load_other(this,filename);
  }
  else {
    local_d1 = '\0';
    assign(this,(uint)local_b0,uVar8,1,3,&local_d1);
    if ((short)local_c4 == 1) {
      if (1 < colormap._width) {
        uVar8 = this->_height;
        sVar11 = (size_t)(int)(uint)local_d0;
        uVar10 = local_c0 & 0xffffffff;
        uVar25 = uVar8;
        while (uVar25 = uVar25 - 1, 0 < (int)uVar8) {
          if (0x17fffff < uVar9) {
            sVar12 = cimg::fread<unsigned_char>(buffer._data,sVar11,(FILE *)__stream);
            if (sVar12 == 0) break;
            fseek(__stream,uVar10,1);
          }
          uVar18 = (ulong)uVar25;
          uVar8 = uVar8 - 1;
          for (lVar15 = 0; lVar15 < (int)this->_width; lVar15 = lVar15 + 1) {
            this->_data[lVar15 + ((ulong)this->_height * 2 + uVar18) * (ulong)this->_width] =
                 (uchar)*colormap._data;
            this->_data[lVar15 + (this->_height + uVar18) * (ulong)this->_width] =
                 *(uchar *)((long)colormap._data + 1);
            this->_data[lVar15 + this->_width * uVar18] = *(uchar *)((long)colormap._data + 2);
          }
        }
      }
    }
    else {
      uVar8 = local_c4 & 0xffff;
      if (uVar8 == 4) {
        if (0xf < colormap._width) {
          uVar8 = this->_height;
          sVar11 = (size_t)(int)(uint)local_d0;
          uVar10 = local_c0 & 0xffffffff;
          uVar25 = uVar8;
          while (puVar4 = buffer._data, uVar25 = uVar25 - 1, 0 < (int)uVar8) {
            if (0x17fffff < uVar9) {
              sVar12 = cimg::fread<unsigned_char>(buffer._data,sVar11,(FILE *)__stream);
              if (sVar12 == 0) break;
              fseek(__stream,uVar10,1);
              pbVar13 = puVar4;
            }
            uVar18 = (ulong)uVar25;
            uVar8 = uVar8 - 1;
            bVar5 = 0xf0;
            bVar16 = 0;
            for (lVar15 = 0; lVar15 < (int)this->_width; lVar15 = lVar15 + 1) {
              if (bVar5 == 0xf0) {
                bVar16 = *pbVar13;
                pbVar13 = pbVar13 + 1;
              }
              bVar20 = (bVar16 & bVar5) >> 4;
              if (bVar5 < 0x10) {
                bVar20 = bVar16 & bVar5;
              }
              uVar19 = (ulong)bVar20;
              this->_data[lVar15 + ((ulong)this->_height * 2 + uVar18) * (ulong)this->_width] =
                   (uchar)colormap._data[uVar19];
              this->_data[lVar15 + (this->_height + uVar18) * (ulong)this->_width] =
                   *(uchar *)((long)colormap._data + uVar19 * 4 + 1);
              this->_data[lVar15 + this->_width * uVar18] =
                   *(uchar *)((long)colormap._data + uVar19 * 4 + 2);
              bVar5 = bVar5 << 4 | bVar5 >> 4;
            }
            pbVar13 = pbVar13 + uVar10;
          }
        }
      }
      else if (uVar8 == 8) {
        if (0xff < colormap._width) {
          uVar8 = this->_height;
          sVar11 = (size_t)(int)(uint)local_d0;
          uVar10 = local_c0 & 0xffffffff;
          uVar25 = uVar8;
          while (puVar4 = buffer._data, uVar25 = uVar25 - 1, 0 < (int)uVar8) {
            if (0x17fffff < uVar9) {
              sVar12 = cimg::fread<unsigned_char>(buffer._data,sVar11,(FILE *)__stream);
              if (sVar12 == 0) break;
              fseek(__stream,uVar10,1);
              pbVar13 = puVar4;
            }
            uVar18 = (ulong)uVar25;
            uVar8 = uVar8 - 1;
            for (lVar15 = 0; lVar15 < (int)this->_width; lVar15 = lVar15 + 1) {
              uVar19 = (ulong)pbVar13[lVar15];
              this->_data[lVar15 + ((ulong)this->_height * 2 + uVar18) * (ulong)this->_width] =
                   (uchar)colormap._data[uVar19];
              this->_data[lVar15 + (this->_height + uVar18) * (ulong)this->_width] =
                   *(uchar *)((long)colormap._data + uVar19 * 4 + 1);
              this->_data[lVar15 + this->_width * uVar18] =
                   *(uchar *)((long)colormap._data + uVar19 * 4 + 2);
            }
            pbVar13 = pbVar13 + lVar15 + uVar10;
          }
        }
      }
      else if (uVar8 == 0x10) {
        uVar8 = this->_height;
        sVar11 = (size_t)(int)(uint)local_d0;
        uVar10 = local_c0 & 0xffffffff;
        uVar25 = uVar8;
        while (puVar4 = buffer._data, uVar25 = uVar25 - 1, 0 < (int)uVar8) {
          puVar23 = pbVar13;
          if (0x17fffff < uVar9) {
            sVar12 = cimg::fread<unsigned_char>(buffer._data,sVar11,(FILE *)__stream);
            if (sVar12 == 0) break;
            fseek(__stream,uVar10,1);
            puVar23 = puVar4;
          }
          uVar18 = (ulong)uVar25;
          uVar8 = uVar8 - 1;
          pbVar13 = puVar23 + uVar10;
          for (lVar15 = 0; lVar15 < (int)this->_width; lVar15 = lVar15 + 1) {
            uVar1 = puVar23[lVar15 * 2];
            bVar16 = puVar23[lVar15 * 2 + 1];
            this->_data[lVar15 + ((ulong)this->_height * 2 + uVar18) * (ulong)this->_width] =
                 uVar1 * '\b';
            this->_data[lVar15 + (this->_height + uVar18) * (ulong)this->_width] =
                 (byte)(CONCAT11(bVar16,uVar1) >> 2) & 0xf8;
            this->_data[lVar15 + this->_width * uVar18] = bVar16 & 0xf8;
            pbVar13 = pbVar13 + 2;
          }
        }
      }
      else if (uVar8 == 0x18) {
        uVar8 = this->_height;
        sVar11 = (size_t)(int)(uint)local_d0;
        uVar10 = local_c0 & 0xffffffff;
        uVar25 = uVar8;
        while (puVar4 = buffer._data, uVar25 = uVar25 - 1, 0 < (int)uVar8) {
          if (0x17fffff < uVar9) {
            sVar12 = cimg::fread<unsigned_char>(buffer._data,sVar11,(FILE *)__stream);
            if (sVar12 == 0) break;
            fseek(__stream,uVar10,1);
            pbVar13 = puVar4;
          }
          uVar18 = (ulong)uVar25;
          uVar8 = uVar8 - 1;
          for (lVar15 = 0; lVar15 < (int)this->_width; lVar15 = lVar15 + 1) {
            this->_data[lVar15 + ((ulong)this->_height * 2 + uVar18) * (ulong)this->_width] =
                 *pbVar13;
            this->_data[lVar15 + (this->_height + uVar18) * (ulong)this->_width] = pbVar13[1];
            this->_data[lVar15 + this->_width * uVar18] = pbVar13[2];
            pbVar13 = pbVar13 + 3;
          }
          pbVar13 = pbVar13 + uVar10;
        }
      }
      else if (uVar8 == 0x20) {
        uVar8 = this->_height;
        sVar11 = (size_t)(int)(uint)local_d0;
        uVar10 = local_c0 & 0xffffffff;
        uVar25 = uVar8;
        while (puVar4 = buffer._data, uVar25 = uVar25 - 1, 0 < (int)uVar8) {
          puVar23 = pbVar13;
          if (0x17fffff < uVar9) {
            sVar12 = cimg::fread<unsigned_char>(buffer._data,sVar11,(FILE *)__stream);
            if (sVar12 == 0) break;
            fseek(__stream,uVar10,1);
            puVar23 = puVar4;
          }
          uVar18 = (ulong)uVar25;
          uVar8 = uVar8 - 1;
          pbVar13 = puVar23 + uVar10;
          for (lVar15 = 0; lVar15 < (int)this->_width; lVar15 = lVar15 + 1) {
            this->_data[lVar15 + ((ulong)this->_height * 2 + uVar18) * (ulong)this->_width] =
                 puVar23[lVar15 * 4];
            this->_data[lVar15 + (this->_height + uVar18) * (ulong)this->_width] =
                 puVar23[lVar15 * 4 + 1];
            this->_data[lVar15 + this->_width * uVar18] = puVar23[lVar15 * 4 + 2];
            pbVar13 = pbVar13 + 4;
          }
        }
      }
    }
    pFVar3 = local_a8;
    if ((int)local_c8 < 0) {
      mirror(this,'y');
    }
    if (pFVar3 == (FILE *)0x0) {
      cimg::fclose(__stream);
    }
  }
  ~CImg(&buffer);
  CImg<int>::~CImg(&colormap);
  ~CImg(&header);
  return this;
}

Assistant:

CImg<T>& _load_bmp(std::FILE *const file, const char *const filename) {
      if (!file && !filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_bmp(): Specified filename is (null).",
                                    cimg_instance);

      std::FILE *const nfile = file?file:cimg::fopen(filename,"rb");
      CImg<ucharT> header(54);
      cimg::fread(header._data,54,nfile);
      if (*header!='B' || header[1]!='M') {
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimg_instance
                              "load_bmp(): Invalid BMP file '%s'.",
                              cimg_instance,
                              filename?filename:"(FILE*)");
      }

      // Read header and pixel buffer
      int
        file_size = header[0x02] + (header[0x03]<<8) + (header[0x04]<<16) + (header[0x05]<<24),
        offset = header[0x0A] + (header[0x0B]<<8) + (header[0x0C]<<16) + (header[0x0D]<<24),
        header_size = header[0x0E] + (header[0x0F]<<8) + (header[0x10]<<16) + (header[0x11]<<24),
        dx = header[0x12] + (header[0x13]<<8) + (header[0x14]<<16) + (header[0x15]<<24),
        dy = header[0x16] + (header[0x17]<<8) + (header[0x18]<<16) + (header[0x19]<<24),
        compression = header[0x1E] + (header[0x1F]<<8) + (header[0x20]<<16) + (header[0x21]<<24),
        nb_colors = header[0x2E] + (header[0x2F]<<8) + (header[0x30]<<16) + (header[0x31]<<24),
        bpp = header[0x1C] + (header[0x1D]<<8);

      if (!file_size || file_size==offset) {
        cimg::fseek(nfile,0,SEEK_END);
        file_size = (int)cimg::ftell(nfile);
        cimg::fseek(nfile,54,SEEK_SET);
      }
      if (header_size>40) cimg::fseek(nfile,header_size - 40,SEEK_CUR);

      const int
        dx_bytes = (bpp==1)?(dx/8 + (dx%8?1:0)):((bpp==4)?(dx/2 + (dx%2)):(int)((longT)dx*bpp/8)),
        align_bytes = (4 - dx_bytes%4)%4;
      const ulongT
        cimg_iobuffer = (ulongT)24*1024*1024,
        buf_size = std::min((ulongT)cimg::abs(dy)*(dx_bytes + align_bytes),(ulongT)file_size - offset);

      CImg<intT> colormap;
      if (bpp<16) { if (!nb_colors) nb_colors = 1<<bpp; } else nb_colors = 0;
      if (nb_colors) { colormap.assign(nb_colors); cimg::fread(colormap._data,nb_colors,nfile); }
      const int xoffset = offset - 14 - header_size - 4*nb_colors;
      if (xoffset>0) cimg::fseek(nfile,xoffset,SEEK_CUR);

      CImg<ucharT> buffer;
      if (buf_size<cimg_iobuffer) {
        buffer.assign(buf_size,1,1,1,0);
        cimg::fread(buffer._data,buf_size,nfile);
      } else buffer.assign(dx_bytes + align_bytes);
      unsigned char *ptrs = buffer;

      // Decompress buffer (if necessary)
      if (compression==1 || compression==2) {
        if (file)
          throw CImgIOException(_cimg_instance
                                "load_bmp(): Unable to load compressed data from '(*FILE)' inputs.",
                                cimg_instance);
        else {
          if (!file) cimg::fclose(nfile);
          return load_other(filename);
        }
      }

      // Read pixel data
      assign(dx,cimg::abs(dy),1,3,0);
      switch (bpp) {
      case 1 : { // Monochrome
        if (colormap._width>=2) for (int y = height() - 1; y>=0; --y) {
          if (buf_size>=cimg_iobuffer) {
            if (!cimg::fread(ptrs=buffer._data,dx_bytes,nfile)) break;
            cimg::fseek(nfile,align_bytes,SEEK_CUR);
          }
          unsigned char mask = 0x80, val = 0;
          cimg_forX(*this,x) {
            if (mask==0x80) val = *(ptrs++);
            const unsigned char *col = (unsigned char*)(colormap._data + (val&mask?1:0));
            (*this)(x,y,2) = (T)*(col++);
            (*this)(x,y,1) = (T)*(col++);
            (*this)(x,y,0) = (T)*(col++);
            mask = cimg::ror(mask);
          }
          ptrs+=align_bytes;
        }
      } break;
      case 4 : { // 16 colors
        if (colormap._width>=16) for (int y = height() - 1; y>=0; --y) {
          if (buf_size>=cimg_iobuffer) {
            if (!cimg::fread(ptrs=buffer._data,dx_bytes,nfile)) break;
            cimg::fseek(nfile,align_bytes,SEEK_CUR);
          }
          unsigned char mask = 0xF0, val = 0;
          cimg_forX(*this,x) {
            if (mask==0xF0) val = *(ptrs++);
            const unsigned char color = (unsigned char)((mask<16)?(val&mask):((val&mask)>>4));
            const unsigned char *col = (unsigned char*)(colormap._data + color);
            (*this)(x,y,2) = (T)*(col++);
            (*this)(x,y,1) = (T)*(col++);
            (*this)(x,y,0) = (T)*(col++);
            mask = cimg::ror(mask,4);
          }
          ptrs+=align_bytes;
        }
      } break;
      case 8 : { // 256 colors
        if (colormap._width>=256) for (int y = height() - 1; y>=0; --y) {
          if (buf_size>=cimg_iobuffer) {
            if (!cimg::fread(ptrs=buffer._data,dx_bytes,nfile)) break;
            cimg::fseek(nfile,align_bytes,SEEK_CUR);
          }
          cimg_forX(*this,x) {
            const unsigned char *col = (unsigned char*)(colormap._data + *(ptrs++));
            (*this)(x,y,2) = (T)*(col++);
            (*this)(x,y,1) = (T)*(col++);
            (*this)(x,y,0) = (T)*(col++);
          }
          ptrs+=align_bytes;
        }
      } break;
      case 16 : { // 16 bits colors (RGB565)
        for (int y = height() - 1; y>=0; --y) {
          if (buf_size>=cimg_iobuffer) {
            if (!cimg::fread(ptrs=buffer._data,dx_bytes,nfile)) break;
            cimg::fseek(nfile,align_bytes,SEEK_CUR);
          }
          cimg_forX(*this,x) {
            const unsigned char c1 = *(ptrs++), c2 = *(ptrs++);
            const unsigned short col = (unsigned short)c2<<8 | c1;
            (*this)(x,y,2) = (T)((col&0x1F)<<3);
            (*this)(x,y,1) = (T)(((col>>5)&0x3F)<<3);
            (*this)(x,y,0) = (T)(((col>>11)&0x1F)<<3);
          }
          ptrs+=align_bytes;
        }
      } break;
      case 24 : { // 24 bits colors
        for (int y = height() - 1; y>=0; --y) {
          if (buf_size>=cimg_iobuffer) {
            if (!cimg::fread(ptrs=buffer._data,dx_bytes,nfile)) break;
            cimg::fseek(nfile,align_bytes,SEEK_CUR);
          }
          cimg_forX(*this,x) {
            (*this)(x,y,2) = (T)*(ptrs++);
            (*this)(x,y,1) = (T)*(ptrs++);
            (*this)(x,y,0) = (T)*(ptrs++);
          }
          ptrs+=align_bytes;
        }
      } break;
      case 32 : { // 32 bits colors
        for (int y = height() - 1; y>=0; --y) {
          if (buf_size>=cimg_iobuffer) {
            if (!cimg::fread(ptrs=buffer._data,dx_bytes,nfile)) break;
            cimg::fseek(nfile,align_bytes,SEEK_CUR);
          }
          cimg_forX(*this,x) {
            (*this)(x,y,2) = (T)*(ptrs++);
            (*this)(x,y,1) = (T)*(ptrs++);
            (*this)(x,y,0) = (T)*(ptrs++);
            ++ptrs;
          }
          ptrs+=align_bytes;
        }
      } break;
      }